

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall cppjieba::DictTrie::LoadDict(DictTrie *this,string *filePath)

{
  byte bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type sVar6;
  Logger *this_00;
  value_type *__x;
  char *__nptr;
  string *in_RSI;
  size_t lineno;
  DictUnit node_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buf;
  string line;
  ifstream ifs;
  DictUnit *in_stack_fffffffffffff960;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_fffffffffffff970;
  Logger *in_stack_fffffffffffff980;
  ostream *in_stack_fffffffffffff990;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9ec;
  int lineno_00;
  char *in_stack_fffffffffffff9f0;
  size_t in_stack_fffffffffffff9f8;
  Logger *in_stack_fffffffffffffa00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa08;
  string *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffaf8;
  double in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb08;
  DictUnit *in_stack_fffffffffffffb10;
  DictTrie *in_stack_fffffffffffffb18;
  allocator<char> local_489;
  string local_488 [32];
  long local_468;
  undefined1 local_3e0 [56];
  Logger local_3a8;
  istream local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,uVar3,8);
  bVar1 = std::ifstream::is_open();
  lineno_00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9ec);
  if ((bVar1 & 1) == 0) {
    limonp::Logger::Logger
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
               lineno_00);
    poVar4 = limonp::Logger::Stream(&local_3a8);
    poVar4 = std::operator<<(poVar4,"exp: [ifs.is_open()");
    poVar4 = std::operator<<(poVar4,"] false. ");
    poVar4 = std::operator<<(poVar4,"open ");
    poVar4 = std::operator<<(poVar4,local_10);
    std::operator<<(poVar4," failed.");
    limonp::Logger::~Logger(in_stack_fffffffffffff980);
  }
  std::__cxx11::string::string((string *)(local_3e0 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1406d8);
  DictUnit::DictUnit(in_stack_fffffffffffff960);
  local_468 = 0;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_218,(string *)(local_3e0 + 0x18));
    uVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!(bool)uVar2) break;
    __s = &local_489;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffff9a0),(char *)__s,
               (allocator<char> *)in_stack_fffffffffffff990);
    limonp::Split(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                  (string *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    std::__cxx11::string::~string(local_488);
    std::allocator<char>::~allocator(&local_489);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3e0);
    if (sVar6 != 3) {
      limonp::Logger::Logger
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
                 lineno_00);
      in_stack_fffffffffffff990 = limonp::Logger::Stream((Logger *)&stack0xfffffffffffff9f0);
      poVar4 = std::operator<<(in_stack_fffffffffffff990,"exp: [buf.size() == DICT_COLUMN_NUM");
      this_00 = (Logger *)std::operator<<(poVar4,"] false. ");
      poVar4 = std::operator<<((ostream *)this_00,"split result illegal, line:");
      std::operator<<(poVar4,(string *)(local_3e0 + 0x18));
      limonp::Logger::~Logger(this_00);
    }
    in_stack_fffffffffffff960 = (DictUnit *)local_3e0;
    __x = (value_type *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff960,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff960,1);
    __nptr = (char *)std::__cxx11::string::c_str();
    in_stack_fffffffffffff970 =
         (vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)atof(__nptr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff960,2);
    MakeNodeInfo(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                 in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::push_back
              (in_stack_fffffffffffff970,__x);
    local_468 = local_468 + 1;
  }
  DictUnit::~DictUnit(in_stack_fffffffffffff960);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff970);
  std::__cxx11::string::~string((string *)(local_3e0 + 0x18));
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void LoadDict(const string& filePath) {
    ifstream ifs(filePath.c_str());
    XCHECK(ifs.is_open()) << "open " << filePath << " failed.";
    string line;
    vector<string> buf;

    DictUnit node_info;
    for (size_t lineno = 0; getline(ifs, line); lineno++) {
      Split(line, buf, " ");
      XCHECK(buf.size() == DICT_COLUMN_NUM) << "split result illegal, line:" << line;
      MakeNodeInfo(node_info, 
            buf[0], 
            atof(buf[1].c_str()), 
            buf[2]);
      static_node_infos_.push_back(node_info);
    }
  }